

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_process_sod(jpc_dec_t *dec,jpc_ms_t *ms)

{
  byte bVar1;
  jpc_dec_tile_t *tile;
  jpc_streamlist_t *pjVar2;
  jpc_ppxstab_t *pjVar3;
  jpc_ppxstabent_t *pjVar4;
  jpc_dec_cp_t *pjVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  jas_stream_t *pjVar9;
  jpc_dec_rlvl_t *pjVar10;
  jpc_dec_band_t **ppjVar11;
  jas_matrix_t *pjVar12;
  jpc_tsfb_t *tsfb;
  jpc_dec_band_t *pjVar13;
  jpc_dec_prc_t *pjVar14;
  jpc_tagtree_t *pjVar15;
  jpc_pi_t *pjVar16;
  jpc_pchg_t *pjVar17;
  byte bVar18;
  jpc_dec_ccp_t *pjVar19;
  uint_fast16_t *puVar20;
  uint *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  char *fmt;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  jpc_dec_tcomp_t *pjVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  uint uVar38;
  jpc_dec_tile_t *pjVar39;
  jpc_pchglist_t *pchglist;
  int local_13a8;
  ulong local_1388;
  ulong local_1368;
  ulong local_1360;
  ulong local_1358;
  jpc_dec_cmpt_t *local_1350;
  jpc_dec_cblk_t *local_1330;
  jpc_tsfb_band_t local_12f8 [100];
  
  tile = dec->curtile;
  if (tile == (jpc_dec_tile_t *)0x0) {
    return -1;
  }
  if (tile->partno == 0) {
    pjVar5 = tile->cp;
    if ((~pjVar5->flags & 3U) != 0) {
      return -1;
    }
    lVar26 = (long)pjVar5->numcomps;
    if (lVar26 != 0) {
      puVar20 = &pjVar5->ccps->numstepsizes;
      do {
        if (*(uint_fast8_t *)((long)puVar20 + -7) == '\x01') {
          if (*puVar20 != 1) {
            return -1;
          }
        }
        else if ((int)*puVar20 <
                 (int)((uint)*(uint_fast8_t *)((long)puVar20 + -0xb) +
                       (uint)*(uint_fast8_t *)((long)puVar20 + -0xb) * 2 + -2)) {
          return -1;
        }
        puVar20 = puVar20 + 0x70;
        lVar26 = lVar26 + -1;
      } while (lVar26 != 0);
    }
    if (0 < pjVar5->numcomps) {
      pjVar19 = pjVar5->ccps;
      iVar7 = 0;
      do {
        if ((pjVar19->csty & 1) == 0) {
          lVar26 = 0x33b;
          do {
            *(undefined1 *)((long)pjVar19->stepsizes + lVar26 + -0x18) = 0xf;
            *(undefined1 *)((long)pjVar19->stepsizes + lVar26 + 9) = 0xf;
            lVar26 = lVar26 + 1;
          } while (lVar26 != 0x35c);
        }
        if ((pjVar19->qsty == '\x01') && (bVar18 = pjVar19->numrlvls, bVar18 != 0)) {
          uVar23 = pjVar19->stepsizes[0];
          uVar32 = (uint)bVar18 + (uint)bVar18 * 2;
          if (uVar32 < 4) {
            uVar32 = 3;
          }
          uVar22 = 0;
          do {
            uVar38 = ((int)uVar22 + 2U) / 3 + ((uint)(uVar23 >> 0xb) & 0x1fffff);
            if (0x1f < uVar38) {
              return -1;
            }
            pjVar19->stepsizes[uVar22] = (ulong)(uVar38 * 0x800 | (uint)uVar23 & 0x7ff);
            uVar22 = uVar22 + 1;
          } while (uVar32 - 2 != uVar22);
        }
        iVar7 = iVar7 + 1;
        pjVar19 = pjVar19 + 1;
      } while (iVar7 < pjVar5->numcomps);
    }
    tile->realmode = 0;
    tile->realmode = (uint)(tile->cp->mctid == '\x01');
    if (0 < dec->numcomps) {
      local_1350 = dec->cmpts;
      pjVar34 = tile->tcomps;
      lVar26 = 0;
      do {
        pjVar19 = tile->cp->ccps;
        if (pjVar19[lVar26].qmfbid == '\0') {
          tile->realmode = 1;
        }
        bVar18 = pjVar19[lVar26].numrlvls;
        pjVar34->numrlvls = (uint)bVar18;
        pjVar10 = (jpc_dec_rlvl_t *)jas_alloc2((ulong)bVar18,0x60);
        pjVar34->rlvls = pjVar10;
        if (pjVar10 == (jpc_dec_rlvl_t *)0x0) {
          return -1;
        }
        uVar32 = pjVar34->numrlvls;
        if (uVar32 != 0) {
          ppjVar11 = &pjVar10->bands;
          do {
            *ppjVar11 = (jpc_dec_band_t *)0x0;
            ppjVar11 = ppjVar11 + 0xc;
            uVar32 = uVar32 - 1;
          } while (uVar32 != 0);
        }
        uVar23 = local_1350->hstep;
        uVar22 = local_1350->vstep;
        pjVar12 = jas_seq2d_create((tile->xstart + (uVar23 - 1)) / uVar23,
                                   (tile->ystart + (uVar22 - 1)) / uVar22,
                                   ((uVar23 - 1) + tile->xend) / uVar23,
                                   ((uVar22 - 1) + tile->yend) / uVar22);
        pjVar34->data = pjVar12;
        if (pjVar12 == (jas_matrix_t *)0x0) {
          return -1;
        }
        tsfb = jpc_cod_gettsfb((uint)pjVar19[lVar26].qmfbid,pjVar34->numrlvls - 1);
        pjVar34->tsfb = tsfb;
        if (tsfb == (jpc_tsfb_t *)0x0) {
          return -1;
        }
        pjVar12 = pjVar34->data;
        jpc_tsfb_getbands(tsfb,pjVar12->xstart_,pjVar12->ystart_,pjVar12->xend_,pjVar12->yend_,
                          local_12f8);
        uVar23 = (ulong)pjVar34->numrlvls;
        if (pjVar34->numrlvls != 0) {
          pjVar10 = pjVar34->rlvls;
          uVar22 = 0;
          do {
            pjVar10->bands = (jpc_dec_band_t *)0x0;
            bVar18 = ~(byte)uVar22 + (char)uVar23;
            lVar37 = (long)(1 << (bVar18 & 0x1f)) + -1;
            uVar28 = pjVar34->xstart + lVar37 >> (bVar18 & 0x3f);
            pjVar10->xstart = uVar28;
            uVar29 = pjVar34->ystart + lVar37 >> (bVar18 & 0x3f);
            pjVar10->ystart = uVar29;
            uVar30 = pjVar34->xend + lVar37 >> (bVar18 & 0x3f);
            pjVar10->xend = uVar30;
            uVar27 = lVar37 + pjVar34->yend >> (bVar18 & 0x3f);
            pjVar10->yend = uVar27;
            bVar18 = pjVar19[lVar26].prcwidthexpns[uVar22];
            pjVar10->prcwidthexpn = (uint)bVar18;
            bVar1 = pjVar19[lVar26].prcheightexpns[uVar22];
            local_1388 = -1L << (bVar18 & 0x3f);
            uVar23 = -1L << (bVar1 & 0x3f);
            pjVar10->prcheightexpn = (uint)bVar1;
            local_1358 = (uVar30 + (long)(1 << (bVar18 & 0x1f))) - 1 & local_1388;
            local_1388 = local_1388 & uVar28;
            local_1368 = uVar23 & uVar29;
            iVar36 = (int)(local_1358 - local_1388 >> (bVar18 & 0x3f));
            pjVar10->numhprcs = iVar36;
            iVar7 = (int)(((uVar27 + (long)(1 << (bVar1 & 0x1f))) - 1 & uVar23) - local_1368 >>
                         (bVar1 & 0x3f));
            pjVar10->numvprcs = iVar7;
            iVar7 = iVar7 * iVar36;
            pjVar10->numprcs = iVar7;
            if (0xffff < iVar7) {
              return -1;
            }
            if ((uVar28 < uVar30) && (uVar29 < uVar27)) {
              if (uVar22 == 0) {
                pjVar10->cbgwidthexpn = (uint)bVar18;
                pjVar10->cbgheightexpn = (uint)bVar1;
                uVar32 = 1;
              }
              else {
                pjVar10->cbgwidthexpn = bVar18 - 1;
                pjVar10->cbgheightexpn = bVar1 - 1;
                if (bVar18 == 0) {
                  return -1;
                }
                if (bVar1 == 0) {
                  return -1;
                }
                local_1358 = local_1358 + 1 >> 1;
                local_1368 = local_1368 + 1 >> 1;
                local_1388 = local_1388 + 1 >> 1;
                uVar32 = 3;
              }
              uVar38 = (uint)pjVar19[lVar26].cblkwidthexpn;
              if (pjVar10->cbgwidthexpn < (int)(uint)pjVar19[lVar26].cblkwidthexpn) {
                uVar38 = pjVar10->cbgwidthexpn;
              }
              pjVar10->cblkwidthexpn = (long)(int)uVar38;
              uVar38 = (uint)pjVar19[lVar26].cblkheightexpn;
              if (pjVar10->cbgheightexpn < (int)(uint)pjVar19[lVar26].cblkheightexpn) {
                uVar38 = pjVar10->cbgheightexpn;
              }
              pjVar10->cblkheightexpn = (long)(int)uVar38;
              pjVar10->numbands = uVar32;
              pjVar13 = (jpc_dec_band_t *)jas_alloc2((ulong)uVar32,0x30);
              pjVar10->bands = pjVar13;
              if (pjVar13 == (jpc_dec_band_t *)0x0) {
                return -1;
              }
              if (0 < pjVar10->numbands) {
                iVar7 = 0;
                do {
                  lVar37 = (long)((int)uVar22 * 3 + -2 + iVar7);
                  if (uVar22 == 0) {
                    lVar37 = 0;
                  }
                  iVar36 = local_12f8[lVar37].orient;
                  pjVar13->orient = iVar36;
                  uVar32 = (uint)pjVar19[lVar26].stepsizes[lVar37];
                  pjVar13->stepsize = uVar32;
                  iVar36 = JPC_NOMINALGAIN((uint)pjVar19[lVar26].qmfbid,pjVar34->numrlvls - 1,
                                           (int)uVar22,iVar36);
                  pjVar13->analgain = iVar36;
                  uVar23 = (ulong)(uVar32 & 0x7ff) * 4 + 0x2000;
                  uVar32 = uVar32 >> 0xb;
                  iVar36 = (iVar36 - uVar32) + (int)local_1350->prec;
                  bVar18 = (byte)iVar36;
                  uVar27 = uVar23 >> (-bVar18 & 0x3f);
                  if (-1 < iVar36) {
                    uVar27 = uVar23 << (bVar18 & 0x3f);
                  }
                  pjVar13->absstepsize = uVar27;
                  iVar36 = uVar32 + pjVar19[lVar26].numguardbits;
                  pjVar13->numbps = pjVar19[lVar26].numguardbits + uVar32 + -1;
                  uVar32 = 0x20 - iVar36;
                  if ((int)((uint)pjVar19[lVar26].roishift + iVar36 + -1) < 0x20) {
                    uVar32 = (uint)pjVar19[lVar26].roishift;
                  }
                  pjVar13->roishift = uVar32;
                  pjVar13->prcs = (jpc_dec_prc_t *)0x0;
                  pjVar13->data = (jas_matrix_t *)0x0;
                  if ((local_12f8[lVar37].xstart != local_12f8[lVar37].xend) &&
                     (local_12f8[lVar37].ystart != local_12f8[lVar37].yend)) {
                    pjVar12 = jas_seq2d_create(0,0,0,0);
                    pjVar13->data = pjVar12;
                    if (pjVar12 == (jas_matrix_t *)0x0) {
                      return -1;
                    }
                    iVar36 = jas_seq2d_bindsub(pjVar12,pjVar34->data,
                                               (long)local_12f8[lVar37].locxstart,
                                               (long)local_12f8[lVar37].locystart,
                                               (long)local_12f8[lVar37].locxend,
                                               (long)local_12f8[lVar37].locyend);
                    if (iVar36 != 0) {
                      return -1;
                    }
                    pjVar12 = pjVar13->data;
                    iVar36 = local_12f8[lVar37].xstart;
                    iVar25 = local_12f8[lVar37].ystart;
                    pjVar12->xstart_ = (long)iVar36;
                    pjVar12->ystart_ = (long)iVar25;
                    pjVar12->xend_ = (long)iVar36 + pjVar12->numcols_;
                    pjVar12->yend_ = (long)iVar25 + pjVar12->numrows_;
                    if ((long)pjVar10->numprcs == 0) {
                      __assert_fail("rlvl->numprcs",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                    ,0x35b,"int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
                    }
                    pjVar14 = (jpc_dec_prc_t *)jas_alloc2((long)pjVar10->numprcs,0x48);
                    pjVar13->prcs = pjVar14;
                    if (pjVar14 == (jpc_dec_prc_t *)0x0) {
                      return -1;
                    }
                    if (0 < pjVar10->numprcs) {
                      local_1360 = local_1368;
                      uVar23 = local_1388;
                      iVar36 = pjVar10->numprcs;
                      do {
                        uVar29 = (long)(1 << ((byte)pjVar10->cbgwidthexpn & 0x1f)) + uVar23;
                        uVar27 = (long)(1 << ((byte)pjVar10->cbgheightexpn & 0x1f)) + local_1360;
                        pjVar12 = pjVar13->data;
                        uVar28 = pjVar12->xstart_;
                        if ((ulong)pjVar12->xstart_ < uVar23) {
                          uVar28 = uVar23;
                        }
                        pjVar14->xstart = uVar28;
                        uVar30 = pjVar12->ystart_;
                        if ((ulong)pjVar12->ystart_ < local_1360) {
                          uVar30 = local_1360;
                        }
                        pjVar14->ystart = uVar30;
                        uVar24 = pjVar12->xend_;
                        if (uVar29 < (ulong)pjVar12->xend_) {
                          uVar24 = uVar29;
                        }
                        pjVar14->xend = uVar24;
                        if ((ulong)pjVar12->yend_ <= uVar27) {
                          uVar27 = pjVar12->yend_;
                        }
                        pjVar14->yend = uVar27;
                        if ((uVar28 < uVar24) && (uVar30 < uVar27)) {
                          bVar18 = (byte)pjVar10->cblkwidthexpn;
                          uVar33 = -1L << (bVar18 & 0x3f);
                          bVar1 = (byte)pjVar10->cblkheightexpn;
                          uVar31 = -1L << (bVar1 & 0x3f);
                          iVar8 = (int)(((uVar24 + (long)(1 << (bVar18 & 0x1f))) - 1 & uVar33) -
                                        (uVar28 & uVar33) >> (bVar18 & 0x3f));
                          pjVar14->numhcblks = iVar8;
                          iVar25 = (int)(((uVar27 + (long)(1 << (bVar1 & 0x1f))) - 1 & uVar31) -
                                         (uVar30 & uVar31) >> (bVar1 & 0x3f));
                          pjVar14->numvcblks = iVar25;
                          pjVar14->numcblks = iVar25 * iVar8;
                          if (iVar25 * iVar8 < 1) {
                            __assert_fail("prc->numcblks > 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                          ,0x37f,
                                          "int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
                          }
                          pjVar15 = jpc_tagtree_create(iVar8,iVar25);
                          pjVar14->incltagtree = pjVar15;
                          if (pjVar15 == (jpc_tagtree_t *)0x0) {
                            return -1;
                          }
                          pjVar15 = jpc_tagtree_create(pjVar14->numhcblks,pjVar14->numvcblks);
                          pjVar14->numimsbstagtree = pjVar15;
                          if (pjVar15 == (jpc_tagtree_t *)0x0) {
                            return -1;
                          }
                          local_1330 = (jpc_dec_cblk_t *)jas_alloc2((long)pjVar14->numcblks,0x50);
                          pjVar14->cblks = local_1330;
                          if (local_1330 == (jpc_dec_cblk_t *)0x0) {
                            return -1;
                          }
                          iVar25 = pjVar14->numcblks;
                          uVar27 = uVar23;
                          uVar28 = local_1360;
                          while (0 < iVar25) {
                            uVar30 = (long)(1 << ((byte)pjVar10->cblkwidthexpn & 0x1f)) + uVar27;
                            uVar24 = (long)(1 << ((byte)pjVar10->cblkheightexpn & 0x1f)) + uVar28;
                            uVar31 = pjVar14->xstart;
                            if (pjVar14->xstart < uVar27) {
                              uVar31 = uVar27;
                            }
                            uVar33 = pjVar14->ystart;
                            if (pjVar14->ystart < uVar28) {
                              uVar33 = uVar28;
                            }
                            if (pjVar14->xend <= uVar30) {
                              uVar30 = pjVar14->xend;
                            }
                            if (pjVar14->yend <= uVar24) {
                              uVar24 = pjVar14->yend;
                            }
                            if ((uVar31 < uVar30) && (uVar33 < uVar24)) {
                              local_1330->numpasses = 0;
                              (local_1330->segs).head = (jpc_dec_seg_t *)0x0;
                              (local_1330->segs).tail = (jpc_dec_seg_t *)0x0;
                              *(undefined8 *)((long)&(local_1330->segs).tail + 4) = 0;
                              *(undefined8 *)((long)&local_1330->curseg + 4) = 0;
                              local_1330->mqdec = (jpc_mqdec_t *)0x0;
                              local_1330->nulldec = (jpc_bitstream_t *)0x0;
                              local_1330->numlenbits = 3;
                              local_1330->firstpassno = -1;
                              local_1330->flags = (jas_matrix_t *)0x0;
                              pjVar12 = jas_seq2d_create(0,0,0,0);
                              local_1330->data = pjVar12;
                              if (pjVar12 == (jas_matrix_t *)0x0) {
                                return -1;
                              }
                              iVar8 = jas_seq2d_bindsub(pjVar12,pjVar13->data,uVar31,uVar33,uVar30,
                                                        uVar24);
                              if (iVar8 != 0) {
                                return -1;
                              }
                              local_1330 = local_1330 + 1;
                              iVar25 = iVar25 + -1;
                            }
                            uVar27 = uVar27 + (long)(1 << ((byte)pjVar10->cblkwidthexpn & 0x1f));
                            if (uVar29 <= uVar27) {
                              uVar28 = uVar28 + (long)(1 << ((byte)pjVar10->cblkheightexpn & 0x1f));
                              uVar27 = uVar23;
                            }
                          }
                        }
                        else {
                          pjVar14->cblks = (jpc_dec_cblk_t *)0x0;
                          pjVar14->incltagtree = (jpc_tagtree_t *)0x0;
                          pjVar14->numimsbstagtree = (jpc_tagtree_t *)0x0;
                        }
                        uVar23 = uVar23 + (long)(1 << ((byte)pjVar10->cbgwidthexpn & 0x1f));
                        if (local_1358 <= uVar23) {
                          local_1360 = local_1360 +
                                       (long)(1 << ((byte)pjVar10->cbgheightexpn & 0x1f));
                          uVar23 = local_1388;
                        }
                        pjVar14 = pjVar14 + 1;
                        bVar6 = 1 < iVar36;
                        iVar36 = iVar36 + -1;
                      } while (bVar6);
                    }
                  }
                  iVar7 = iVar7 + 1;
                  pjVar13 = pjVar13 + 1;
                } while (iVar7 < pjVar10->numbands);
              }
            }
            else {
              pjVar10->bands = (jpc_dec_band_t *)0x0;
              pjVar10->numprcs = 0;
              pjVar10->numhprcs = 0;
              pjVar10->numvprcs = 0;
            }
            uVar22 = uVar22 + 1;
            pjVar10 = pjVar10 + 1;
            uVar23 = (ulong)pjVar34->numrlvls;
          } while (uVar22 < uVar23);
        }
        lVar26 = lVar26 + 1;
        pjVar34 = pjVar34 + 1;
        local_1350 = local_1350 + 1;
      } while (lVar26 < dec->numcomps);
    }
    pjVar16 = jpc_dec_pi_create(dec,tile);
    tile->pi = pjVar16;
    if (pjVar16 == (jpc_pi_t *)0x0) {
      return -1;
    }
    pchglist = tile->cp->pchglist;
    iVar7 = jpc_pchglist_numpchgs(pchglist);
    if (0 < iVar7) {
      iVar7 = 0;
      do {
        pjVar17 = jpc_pchglist_get(pchglist,iVar7);
        pjVar17 = jpc_pchg_copy(pjVar17);
        if (pjVar17 == (jpc_pchg_t *)0x0) {
          __assert_fail("pchg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                        ,0x3ce,"int jpc_dec_tileinit(jpc_dec_t *, jpc_dec_tile_t *)");
        }
        jpc_pi_addpchg(tile->pi,pjVar17);
        iVar7 = iVar7 + 1;
        pchglist = tile->cp->pchglist;
        iVar36 = jpc_pchglist_numpchgs(pchglist);
      } while (iVar7 < iVar36);
    }
    jpc_pi_init(tile->pi);
  }
  pjVar2 = dec->pkthdrstreams;
  if (pjVar2 != (jpc_streamlist_t *)0x0) {
    iVar7 = pjVar2->numstreams;
    if ((long)iVar7 < 1) {
      abort();
    }
    pjVar9 = *pjVar2->streams;
    if (iVar7 != 1) {
      lVar26 = 1;
      do {
        pjVar2->streams[lVar26 + -1] = pjVar2->streams[lVar26];
        lVar26 = lVar26 + 1;
      } while (iVar7 != lVar26);
    }
    pjVar2->numstreams = iVar7 + -1;
    tile->pkthdrstream = pjVar9;
    if (pjVar9 == (jas_stream_t *)0x0) {
      return -1;
    }
  }
  if (tile->pptstab != (jpc_ppxstab_t *)0x0) {
    if (tile->pkthdrstream == (jas_stream_t *)0x0) {
      pjVar9 = jas_stream_memopen((char *)0x0,0);
      tile->pkthdrstream = pjVar9;
      if (pjVar9 == (jas_stream_t *)0x0) {
        return -1;
      }
    }
    pjVar9 = tile->pkthdrstream;
    lVar26 = jas_stream_tell(pjVar9);
    jas_stream_seek(pjVar9,0,2);
    pjVar3 = tile->pptstab;
    if (0 < pjVar3->numents) {
      pjVar9 = tile->pkthdrstream;
      lVar37 = 0;
      do {
        pjVar4 = pjVar3->ents[lVar37];
        iVar7 = jas_stream_write(pjVar9,pjVar4->data,(uint)pjVar4->len);
        if (iVar7 != (int)pjVar4->len) {
          return -1;
        }
        lVar37 = lVar37 + 1;
      } while (lVar37 < pjVar3->numents);
    }
    local_13a8 = (int)lVar26;
    jas_stream_seek(tile->pkthdrstream,(long)local_13a8,0);
    jpc_ppxstab_destroy(tile->pptstab);
    tile->pptstab = (jpc_ppxstab_t *)0x0;
  }
  iVar7 = jas_getdbglevel();
  if (9 < iVar7) {
    if ((dec->numtiles != 0) && (dec->tiles == (jpc_dec_tile_t *)0x0)) {
      __assert_fail("!dec->numtiles || dec->tiles",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                    ,0x887,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
    }
    if (0 < dec->numtiles) {
      pjVar39 = dec->tiles;
      iVar7 = 0;
      do {
        if ((dec->numcomps != 0) && (pjVar39->tcomps == (jpc_dec_tcomp_t *)0x0)) {
          __assert_fail("!dec->numcomps || tile->tcomps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                        ,0x88a,"int jpc_dec_dump(jpc_dec_t *, FILE *)");
        }
        if (0 < dec->numcomps) {
          puVar21 = &pjVar39->tcomps->numrlvls;
          iVar36 = 0;
          do {
            if (*puVar21 != 0) {
              jpc_dec_process_sod_cold_1();
            }
            iVar36 = iVar36 + 1;
            puVar21 = puVar21 + 0x10;
          } while (iVar36 < dec->numcomps);
        }
        iVar7 = iVar7 + 1;
        pjVar39 = pjVar39 + 1;
      } while (iVar7 < dec->numtiles);
    }
  }
  pjVar9 = tile->pkthdrstream;
  if (pjVar9 == (jas_stream_t *)0x0) {
    pjVar9 = dec->in;
  }
  iVar7 = jpc_dec_decodepkts(dec,pjVar9,dec->in);
  if (iVar7 != 0) {
    fmt = "jpc_dec_decodepkts failed\n";
LAB_0011c468:
    jas_eprintf(fmt);
    return -1;
  }
  lVar26 = dec->curtileendoff;
  if (0 < lVar26) {
    lVar37 = dec->in->rwcnt_;
    lVar35 = lVar37 - lVar26;
    if (lVar37 < lVar26) {
      jas_eprintf("warning: ignoring trailing garbage (%lu bytes)\n",lVar26 - lVar37);
      do {
        pjVar9 = dec->in;
        if ((pjVar9->flags_ & 7U) != 0) {
LAB_0011cfc9:
          fmt = "read error\n";
          goto LAB_0011c468;
        }
        if ((-1 < pjVar9->rwlimit_) && (pjVar9->rwlimit_ <= pjVar9->rwcnt_)) {
          pjVar9->flags_ = pjVar9->flags_ | 4;
          goto LAB_0011cfc9;
        }
        iVar7 = pjVar9->cnt_;
        pjVar9->cnt_ = iVar7 + -1;
        if (iVar7 < 1) {
          iVar7 = jas_stream_fillbuf(pjVar9,1);
          if (iVar7 == -1) goto LAB_0011cfc9;
        }
        else {
          pjVar9->rwcnt_ = pjVar9->rwcnt_ + 1;
          pjVar9->ptr_ = pjVar9->ptr_ + 1;
        }
        lVar35 = lVar35 + 1;
      } while (lVar35 != 0);
    }
    else if (lVar35 != 0 && lVar26 <= lVar37) {
      jas_eprintf("warning: not enough tile data (%lu bytes)\n",lVar35);
    }
  }
  if ((0 < tile->numparts) && (tile->partno == tile->numparts + -1)) {
    iVar7 = jpc_dec_tiledecode(dec,tile);
    if (iVar7 != 0) {
      return -1;
    }
    jpc_dec_tilefini(dec,tile);
  }
  dec->curtile = (jpc_dec_tile_t *)0x0;
  tile->partno = tile->partno + 1;
  dec->state = 8;
  return 0;
}

Assistant:

static int jpc_dec_process_sod(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_dec_tile_t *tile;
	int pos;

	/* Eliminate compiler warnings about unused variables. */
	(void)ms;

	if (!(tile = dec->curtile)) {
		return -1;
	}

	if (!tile->partno) {
		if (!jpc_dec_cp_isvalid(tile->cp)) {
			return -1;
		}
		if (jpc_dec_cp_prepare(tile->cp)) {
			return -1;
		}
		if (jpc_dec_tileinit(dec, tile)) {
			return -1;
		}
	}

	/* Are packet headers stored in the main header or tile-part header? */
	if (dec->pkthdrstreams) {
		/* Get the stream containing the packet header data for this
		  tile-part. */
		if (!(tile->pkthdrstream = jpc_streamlist_remove(dec->pkthdrstreams, 0))) {
			return -1;
		}
	}

	if (tile->pptstab) {
		if (!tile->pkthdrstream) {
			if (!(tile->pkthdrstream = jas_stream_memopen(0, 0))) {
				return -1;
			}
		}
		pos = jas_stream_tell(tile->pkthdrstream);
		jas_stream_seek(tile->pkthdrstream, 0, SEEK_END);
		if (jpc_pptstabwrite(tile->pkthdrstream, tile->pptstab)) {
			return -1;
		}
		jas_stream_seek(tile->pkthdrstream, pos, SEEK_SET);
		jpc_ppxstab_destroy(tile->pptstab);
		tile->pptstab = 0;
	}

	if (jas_getdbglevel() >= 10) {
		jpc_dec_dump(dec, stderr);
	}

	if (jpc_dec_decodepkts(dec, (tile->pkthdrstream) ? tile->pkthdrstream :
	  dec->in, dec->in)) {
		jas_eprintf("jpc_dec_decodepkts failed\n");
		return -1;
	}

	/* Gobble any unconsumed tile data. */
	if (dec->curtileendoff > 0) {
		long curoff;
		uint_fast32_t n;
		curoff = jas_stream_getrwcount(dec->in);
		if (curoff < dec->curtileendoff) {
			n = dec->curtileendoff - curoff;
			jas_eprintf("warning: ignoring trailing garbage (%lu bytes)\n",
			  (unsigned long) n);

			while (n-- > 0) {
				if (jas_stream_getc(dec->in) == EOF) {
					jas_eprintf("read error\n");
					return -1;
				}
			}
		} else if (curoff > dec->curtileendoff) {
			jas_eprintf("warning: not enough tile data (%lu bytes)\n",
			  (unsigned long) curoff - dec->curtileendoff);
		}

	}

	if (tile->numparts > 0 && tile->partno == tile->numparts - 1) {
		if (jpc_dec_tiledecode(dec, tile)) {
			return -1;
		}
		jpc_dec_tilefini(dec, tile);
	}

	dec->curtile = 0;

	/* Increment the expected tile-part number. */
	++tile->partno;

	/* We should expect to encounter a SOT marker segment next. */
	dec->state = JPC_TPHSOT;

	return 0;
}